

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int isoent_alloc_path_table(archive_write *a,vdd *vdd,int max_depth)

{
  path_table *ppVar1;
  int iVar2;
  ulong uVar3;
  
  vdd->max_depth = max_depth;
  ppVar1 = (path_table *)malloc((long)max_depth << 5);
  vdd->pathtbl = ppVar1;
  if (ppVar1 == (path_table *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
    iVar2 = -0x1e;
  }
  else if (max_depth < 1) {
    iVar2 = 0;
  }
  else {
    uVar3 = (ulong)(uint)max_depth;
    do {
      iVar2 = 0;
      ppVar1->first = (isoent *)0x0;
      ppVar1->last = &ppVar1->first;
      ppVar1->sorted = (isoent **)0x0;
      ppVar1->cnt = 0;
      ppVar1 = ppVar1 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return iVar2;
}

Assistant:

static int
isoent_alloc_path_table(struct archive_write *a, struct vdd *vdd,
    int max_depth)
{
	int i;

	vdd->max_depth = max_depth;
	vdd->pathtbl = malloc(sizeof(*vdd->pathtbl) * vdd->max_depth);
	if (vdd->pathtbl == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	for (i = 0; i < vdd->max_depth; i++) {
		vdd->pathtbl[i].first = NULL;
		vdd->pathtbl[i].last = &(vdd->pathtbl[i].first);
		vdd->pathtbl[i].sorted = NULL;
		vdd->pathtbl[i].cnt = 0;
	}
	return (ARCHIVE_OK);
}